

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall jsonnet::internal::anon_unknown_0::Interpreter::joinStrings(Interpreter *this)

{
  pointer pFVar1;
  HeapEntity *pHVar2;
  _func_int **pp_Var3;
  HeapEntity *context;
  uint idx;
  Value VVar4;
  
  pFVar1 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pHVar2 = pFVar1[-1].val2.v.h;
  idx = pFVar1[-1].elementId;
  while( true ) {
    pp_Var3 = pHVar2[1]._vptr_HeapEntity;
    if ((ulong)(*(long *)&pHVar2[1].mark - (long)pp_Var3 >> 3) <= (ulong)idx) {
      VVar4 = makeString(this,&pFVar1[-1].str);
      (this->scratch).t = STRING;
      (this->scratch).v = VVar4._0_8_;
      return (AST *)0x0;
    }
    context = (HeapEntity *)pp_Var3[idx];
    if (context->field_0xa == '\0') break;
    joinString(this,&pFVar1[-1].first,&pFVar1[-1].str,&pFVar1[-1].val,idx,(Value *)(context + 1));
    idx = pFVar1[-1].elementId + 1;
    pFVar1[-1].elementId = idx;
  }
  Stack::newCall(&this->stack,&pFVar1[-1].location,context,*(HeapObject **)&context[5].mark,
                 *(uint *)&context[6]._vptr_HeapEntity,(BindingFrame *)&context[2].mark);
  return *(AST **)&context[6].mark;
}

Assistant:

const AST *joinStrings(void)
    {
        Frame &f = stack.top();
        const auto& elements = static_cast<HeapArray*>(f.val2.v.h)->elements;
        while (f.elementId < elements.size()) {
            auto *th = elements[f.elementId];
            if (th->filled) {
                joinString(f.first, f.str, f.val, f.elementId, th->content);
                f.elementId++;
            } else {
                stack.newCall(f.location, th, th->self, th->offset, th->upValues);
                return th->body;
            }
        }
        scratch = makeString(f.str);
        return nullptr;
    }